

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

cmStateSnapshot * __thiscall cmState::Reset(cmStateSnapshot *__return_storage_ptr__,cmState *this)

{
  cmLinkedTree<cmStateDetail::PolicyStackEntry> *this_00;
  cmLinkedTree<cmDefinitions> *this_01;
  pointer pcVar1;
  StackIter begin;
  StackIter end;
  StackIter begin_00;
  StackIter end_00;
  bool bVar2;
  PointerType pBVar3;
  PointerType pSVar4;
  char *pcVar5;
  PointerType pcVar6;
  iterator iVar7;
  allocator local_a1;
  PositionType pos;
  allocator local_89;
  iterator it;
  string binDir;
  string local_48;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
           *)&this->GlobalProperties);
  std::
  _Rb_tree<cmProperty::ScopeType,_std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>,_std::_Select1st<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
  ::clear((_Rb_tree<cmProperty::ScopeType,_std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>,_std::_Select1st<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
           *)this);
  pos = cmLinkedTree<cmStateDetail::SnapshotDataType>::Truncate(&this->SnapshotData);
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Truncate(&this->ExecutionListFiles);
  it = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::Truncate
                 (&this->BuildsystemDirectory);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&pBVar3->IncludeDirectories);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
            (&pBVar3->IncludeDirectoryBacktraces);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&pBVar3->CompileDefinitions);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
            (&pBVar3->CompileDefinitionsBacktraces);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&pBVar3->CompileOptions);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
            (&pBVar3->CompileOptionsBacktraces);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  (pBVar3->DirectoryEnd).Tree = pos.Tree;
  (pBVar3->DirectoryEnd).Position = pos.Position;
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&pBVar3->NormalTargetNames);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
           *)&pBVar3->Properties);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  pcVar1 = (pBVar3->Children).super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pBVar3->Children).super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
      _M_impl.super__Vector_impl_data._M_finish != pcVar1) {
    (pBVar3->Children).super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl
    .super__Vector_impl_data._M_finish = pcVar1;
  }
  this_00 = &this->PolicyStack;
  cmLinkedTree<cmStateDetail::PolicyStackEntry>::Clear(this_00);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
  (pSVar4->Policies).Tree = this_00;
  (pSVar4->Policies).Position = 0;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
  (pSVar4->PolicyRoot).Tree = this_00;
  (pSVar4->PolicyRoot).Position = 0;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
  (pSVar4->PolicyScope).Tree = this_00;
  (pSVar4->PolicyScope).Position = 0;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
  bVar2 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::IsValid(&pSVar4->Policies);
  if (bVar2) {
    pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
    bVar2 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::IsValid(&pSVar4->PolicyRoot);
    if (bVar2) {
      std::__cxx11::string::string((string *)&binDir,"CMAKE_SOURCE_DIR",(allocator *)&local_48);
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      begin.Tree = (pSVar4->Vars).Tree;
      begin.Position = (pSVar4->Vars).Position;
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      end.Tree = (pSVar4->Root).Tree;
      end.Position = (pSVar4->Root).Position;
      pcVar5 = cmDefinitions::Get(&binDir,begin,end);
      std::__cxx11::string::string((string *)&it,pcVar5,&local_a1);
      std::__cxx11::string::~string((string *)&binDir);
      std::__cxx11::string::string((string *)&local_48,"CMAKE_BINARY_DIR",&local_a1);
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      begin_00.Tree = (pSVar4->Vars).Tree;
      begin_00.Position = (pSVar4->Vars).Position;
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      end_00.Tree = (pSVar4->Root).Tree;
      end_00.Position = (pSVar4->Root).Position;
      pcVar5 = cmDefinitions::Get(&local_48,begin_00,end_00);
      std::__cxx11::string::string((string *)&binDir,pcVar5,&local_89);
      std::__cxx11::string::~string((string *)&local_48);
      this_01 = &this->VarTree;
      cmLinkedTree<cmDefinitions>::Clear(this_01);
      iVar7.Position = 0;
      iVar7.Tree = this_01;
      iVar7 = cmLinkedTree<cmDefinitions>::Push(this_01,iVar7);
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      pSVar4->Vars = iVar7;
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      (pSVar4->Parent).Tree = this_01;
      (pSVar4->Parent).Position = 0;
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      (pSVar4->Root).Tree = this_01;
      (pSVar4->Root).Position = 0;
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      pcVar6 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
      std::__cxx11::string::string((string *)&local_48,"CMAKE_SOURCE_DIR",&local_a1);
      cmDefinitions::Set(pcVar6,&local_48,(char *)it.Tree);
      std::__cxx11::string::~string((string *)&local_48);
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      pcVar6 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
      std::__cxx11::string::string((string *)&local_48,"CMAKE_BINARY_DIR",&local_a1);
      cmDefinitions::Set(pcVar6,&local_48,binDir._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&binDir);
      std::__cxx11::string::~string((string *)&it);
      std::__cxx11::string::string((string *)&it,"RULE_LAUNCH_COMPILE",(allocator *)&binDir);
      DefineProperty(this,(string *)&it,DIRECTORY,"","",true);
      std::__cxx11::string::~string((string *)&it);
      std::__cxx11::string::string((string *)&it,"RULE_LAUNCH_LINK",(allocator *)&binDir);
      DefineProperty(this,(string *)&it,DIRECTORY,"","",true);
      std::__cxx11::string::~string((string *)&it);
      std::__cxx11::string::string((string *)&it,"RULE_LAUNCH_CUSTOM",(allocator *)&binDir);
      DefineProperty(this,(string *)&it,DIRECTORY,"","",true);
      std::__cxx11::string::~string((string *)&it);
      std::__cxx11::string::string((string *)&it,"RULE_LAUNCH_COMPILE",(allocator *)&binDir);
      DefineProperty(this,(string *)&it,TARGET,"","",true);
      std::__cxx11::string::~string((string *)&it);
      std::__cxx11::string::string((string *)&it,"RULE_LAUNCH_LINK",(allocator *)&binDir);
      DefineProperty(this,(string *)&it,TARGET,"","",true);
      std::__cxx11::string::~string((string *)&it);
      std::__cxx11::string::string((string *)&it,"RULE_LAUNCH_CUSTOM",(allocator *)&binDir);
      DefineProperty(this,(string *)&it,TARGET,"","",true);
      std::__cxx11::string::~string((string *)&it);
      cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,this,pos);
      return __return_storage_ptr__;
    }
    __assert_fail("pos->PolicyRoot.IsValid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmState.cxx"
                  ,0x102,"cmStateSnapshot cmState::Reset()");
  }
  __assert_fail("pos->Policies.IsValid()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmState.cxx"
                ,0x101,"cmStateSnapshot cmState::Reset()");
}

Assistant:

cmStateSnapshot cmState::Reset()
{
  this->GlobalProperties.clear();
  this->PropertyDefinitions.clear();

  cmStateDetail::PositionType pos = this->SnapshotData.Truncate();
  this->ExecutionListFiles.Truncate();

  {
    cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator it =
      this->BuildsystemDirectory.Truncate();
    it->IncludeDirectories.clear();
    it->IncludeDirectoryBacktraces.clear();
    it->CompileDefinitions.clear();
    it->CompileDefinitionsBacktraces.clear();
    it->CompileOptions.clear();
    it->CompileOptionsBacktraces.clear();
    it->DirectoryEnd = pos;
    it->NormalTargetNames.clear();
    it->Properties.clear();
    it->Children.clear();
  }

  this->PolicyStack.Clear();
  pos->Policies = this->PolicyStack.Root();
  pos->PolicyRoot = this->PolicyStack.Root();
  pos->PolicyScope = this->PolicyStack.Root();
  assert(pos->Policies.IsValid());
  assert(pos->PolicyRoot.IsValid());

  {
    std::string srcDir =
      cmDefinitions::Get("CMAKE_SOURCE_DIR", pos->Vars, pos->Root);
    std::string binDir =
      cmDefinitions::Get("CMAKE_BINARY_DIR", pos->Vars, pos->Root);
    this->VarTree.Clear();
    pos->Vars = this->VarTree.Push(this->VarTree.Root());
    pos->Parent = this->VarTree.Root();
    pos->Root = this->VarTree.Root();

    pos->Vars->Set("CMAKE_SOURCE_DIR", srcDir.c_str());
    pos->Vars->Set("CMAKE_BINARY_DIR", binDir.c_str());
  }

  this->DefineProperty("RULE_LAUNCH_COMPILE", cmProperty::DIRECTORY, "", "",
                       true);
  this->DefineProperty("RULE_LAUNCH_LINK", cmProperty::DIRECTORY, "", "",
                       true);
  this->DefineProperty("RULE_LAUNCH_CUSTOM", cmProperty::DIRECTORY, "", "",
                       true);

  this->DefineProperty("RULE_LAUNCH_COMPILE", cmProperty::TARGET, "", "",
                       true);
  this->DefineProperty("RULE_LAUNCH_LINK", cmProperty::TARGET, "", "", true);
  this->DefineProperty("RULE_LAUNCH_CUSTOM", cmProperty::TARGET, "", "", true);

  return cmStateSnapshot(this, pos);
}